

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_disconnect(Curl_easy *data,connectdata *conn,_Bool dead_connection)

{
  CURLcode CVar1;
  imap_conn *imapc;
  _Bool dead_connection_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if ((*(byte *)((long)&conn->proto + 0xfb) >> 5 & 1) != 0) {
    if (((!dead_connection) && (((ulong)conn->bits >> 0xd & 1) != 0)) &&
       (CVar1 = imap_perform_logout(data), CVar1 == CURLE_OK)) {
      imap_block_statemach(data,conn,true);
    }
    Curl_pp_disconnect(&(conn->proto).ftpc.pp);
    Curl_dyn_free(&(conn->proto).imapc.dyn);
    Curl_sasl_cleanup(conn,*(unsigned_short *)((long)&conn->proto + 0xbc));
    (*Curl_cfree)((conn->proto).imapc.mailbox);
    (conn->proto).ftpc.retr_size_saved = 0;
    (*Curl_cfree)((conn->proto).ftpc.server_os);
    (conn->proto).ftpc.server_os = (char *)0x0;
    memset(&conn->proto,0,0x100);
  }
  return CURLE_OK;
}

Assistant:

static CURLcode imap_disconnect(struct Curl_easy *data,
                                struct connectdata *conn, bool dead_connection)
{
  struct imap_conn *imapc = &conn->proto.imapc;
  (void)data;

  if(imapc->initialised) {
    /* We cannot send quit unconditionally. If this connection is stale or
       bad in any way, sending quit and waiting around here will make the
       disconnect wait in vain and cause more problems than we need to. */

    /* The IMAP session may or may not have been allocated/setup at this
       point! */
    if(!dead_connection && conn->bits.protoconnstart) {
      if(!imap_perform_logout(data))
        (void)imap_block_statemach(data, conn, TRUE); /* ignore errors */
    }

    /* Disconnect from the server */
    Curl_pp_disconnect(&imapc->pp);
    Curl_dyn_free(&imapc->dyn);

    /* Cleanup the SASL module */
    Curl_sasl_cleanup(conn, imapc->sasl.authused);

    /* Cleanup our connection based variables */
    Curl_safefree(imapc->mailbox);
    Curl_safefree(imapc->mailbox_uidvalidity);
    memset(imapc, 0, sizeof(*imapc));
  }

  return CURLE_OK;
}